

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSValueTest.cpp
# Opt level: O2

void test_dt_double(void)

{
  XSValue_Data expValue;
  XSValue_Data expValue_00;
  XSValue_Data expValue_01;
  XSValue_Data expValue_02;
  XSValue_Data expValue_03;
  XSValue_Data expValue_04;
  XSValue_Data expValue_05;
  XSValue_Data expValue_06;
  XSValue_Data expValue_07;
  char *pcVar1;
  char cVar2;
  bool bVar3;
  XSValue_Data *pXVar4;
  XSValue *pXVar5;
  char *pcVar6;
  wchar16 *pwVar7;
  long lVar8;
  void *pvVar9;
  int iVar10;
  Status myStatus;
  StrX local_458;
  Status myStatus_22;
  char lex_v_ran_iv_4_canrep [2];
  char lex_v_ran_iv_3_canrep [2];
  char lex_iv_2 [8];
  char lex_iv_1 [9];
  char lex_v_ran_iv_2_canrep [5];
  char lex_v_ran_iv_1_canrep [4];
  char data_canrep_4 [6];
  char data_rawstr_2 [8];
  char data_rawstr_5 [11];
  char data_rawstr_4 [11];
  char data_canrep_5 [9];
  char data_canrep_2 [9];
  char data_canrep_3 [10];
  char data_canrep_1 [10];
  char lex_v_ran_iv_4 [25];
  char lex_v_ran_iv_3 [25];
  char lex_v_ran_iv_2 [25];
  char lex_v_ran_iv_1 [25];
  char data_rawstr_3 [14];
  char data_rawstr_1 [17];
  char lex_v_ran_v_4 [25];
  char lex_v_ran_v_3 [25];
  char lex_v_ran_v_2 [25];
  char lex_v_ran_v_1 [25];
  char lex_v_ran_v_0 [17];
  ulong local_260;
  undefined4 uStack_24c;
  undefined4 uStack_248;
  undefined4 uStack_244;
  undefined4 uStack_240;
  ulong local_238;
  undefined4 uStack_224;
  undefined4 uStack_220;
  undefined4 uStack_21c;
  undefined4 uStack_218;
  ulong local_210;
  undefined4 uStack_1f8;
  undefined4 uStack_1f4;
  undefined4 uStack_1f0;
  ulong local_1e8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  undefined4 uStack_1c8;
  undefined8 local_1c0;
  undefined8 local_198;
  undefined8 local_170;
  undefined8 local_148;
  undefined8 local_120;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined4 local_e8;
  undefined8 local_e4;
  undefined8 uStack_dc;
  undefined4 local_d4;
  long local_d0;
  undefined8 uStack_c8;
  undefined4 local_c0;
  undefined8 local_bc;
  undefined8 uStack_b4;
  undefined4 local_ac;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  int iVar11;
  
  builtin_strncpy(lex_v_ran_v_0,"   1234.e+10   \n",0x11);
  builtin_strncpy(lex_v_ran_v_1 + 0x10,"158e+308",9);
  builtin_strncpy(lex_v_ran_v_1,"+1.7976931348623",0x10);
  builtin_strncpy(lex_v_ran_v_2 + 0x10,"158e+308",9);
  builtin_strncpy(lex_v_ran_v_2,"-1.7976931348623",0x10);
  builtin_strncpy(lex_v_ran_v_3 + 0x10,"014e-308",9);
  builtin_strncpy(lex_v_ran_v_3,"+2.2250738585072",0x10);
  builtin_strncpy(lex_v_ran_v_4 + 0x10,"014e-308",9);
  builtin_strncpy(lex_v_ran_v_4,"-2.2250738585072",0x10);
  builtin_strncpy(lex_v_ran_iv_1 + 0x10,"158e+309",9);
  builtin_strncpy(lex_v_ran_iv_1,"+1.7976931348623",0x10);
  builtin_strncpy(lex_v_ran_iv_2 + 0x10,"158e+309",9);
  builtin_strncpy(lex_v_ran_iv_2,"-1.7976931348623",0x10);
  builtin_strncpy(lex_v_ran_iv_3 + 0x10,"014e-329",9);
  builtin_strncpy(lex_v_ran_iv_3,"+2.2250738585072",0x10);
  builtin_strncpy(lex_v_ran_iv_4 + 0x10,"014e-329",9);
  builtin_strncpy(lex_v_ran_iv_4,"-2.2250738585072",0x10);
  builtin_strncpy(lex_v_ran_iv_1_canrep,"INF",4);
  builtin_strncpy(lex_v_ran_iv_2_canrep,"-INF",5);
  lex_v_ran_iv_3_canrep[0] = '0';
  lex_v_ran_iv_3_canrep[1] = '\0';
  lex_v_ran_iv_4_canrep[0] = '0';
  lex_v_ran_iv_4_canrep[1] = '\0';
  builtin_strncpy(lex_iv_1,"12x.e+10",9);
  builtin_strncpy(lex_iv_2,"12.e+1x",8);
  builtin_strncpy(data_rawstr_1,"    -123.45    \n",0x11);
  builtin_strncpy(data_canrep_1,"-1.2345E2",10);
  builtin_strncpy(data_rawstr_2,"+123.45",8);
  builtin_strncpy(data_canrep_2,"1.2345E2",9);
  builtin_strncpy(data_rawstr_3 + 8,"+0012",6);
  builtin_strncpy(data_rawstr_3,"+123.45e",8);
  builtin_strncpy(data_canrep_3,"1.2345E14",10);
  builtin_strncpy(data_rawstr_4,"+100.000e2",0xb);
  builtin_strncpy(data_canrep_4,"1.0E4",6);
  builtin_strncpy(data_rawstr_5,"00100.23e2",0xb);
  builtin_strncpy(data_canrep_5,"1.0023E4",9);
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_458,lex_v_ran_v_0);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_458.fUnicodeForm,dt_double,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_458);
  if (cVar2 == '\0') {
    StrX::StrX(&local_458,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x4ae,lex_v_ran_v_0,local_458.fLocalForm,1);
    StrX::~StrX(&local_458);
    errSeen = 1;
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_458,lex_v_ran_v_1);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_458.fUnicodeForm,dt_double,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_458);
  if (cVar2 == '\0') {
    StrX::StrX(&local_458,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x4af,lex_v_ran_v_1,local_458.fLocalForm,1);
    StrX::~StrX(&local_458);
    errSeen = 1;
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_458,lex_v_ran_v_2);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_458.fUnicodeForm,dt_double,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_458);
  if (cVar2 == '\0') {
    StrX::StrX(&local_458,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x4b0,lex_v_ran_v_2,local_458.fLocalForm,1);
    StrX::~StrX(&local_458);
    errSeen = 1;
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_458,lex_v_ran_v_3);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_458.fUnicodeForm,dt_double,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_458);
  if (cVar2 == '\0') {
    StrX::StrX(&local_458,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x4b1,lex_v_ran_v_3,local_458.fLocalForm,1);
    StrX::~StrX(&local_458);
    errSeen = 1;
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_458,lex_v_ran_v_4);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_458.fUnicodeForm,dt_double,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_458);
  if (cVar2 == '\0') {
    StrX::StrX(&local_458,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x4b2,lex_v_ran_v_4,local_458.fLocalForm,1);
    StrX::~StrX(&local_458);
    errSeen = 1;
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_458,lex_v_ran_iv_1);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_458.fUnicodeForm,dt_double,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_458);
  if (cVar2 == '\0') {
    StrX::StrX(&local_458,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x4b5,lex_v_ran_iv_1,local_458.fLocalForm,1);
    StrX::~StrX(&local_458);
    errSeen = 1;
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_458,lex_v_ran_iv_2);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_458.fUnicodeForm,dt_double,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_458);
  if (cVar2 == '\0') {
    StrX::StrX(&local_458,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x4b6,lex_v_ran_iv_2,local_458.fLocalForm,1);
    StrX::~StrX(&local_458);
    errSeen = 1;
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_458,lex_v_ran_iv_3);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_458.fUnicodeForm,dt_double,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_458);
  if (cVar2 == '\0') {
    StrX::StrX(&local_458,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x4b7,lex_v_ran_iv_3,local_458.fLocalForm,1);
    StrX::~StrX(&local_458);
    errSeen = 1;
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_458,lex_v_ran_iv_4);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_458.fUnicodeForm,dt_double,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_458);
  if (cVar2 == '\0') {
    StrX::StrX(&local_458,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x4b8,lex_v_ran_iv_4,local_458.fLocalForm,1);
    StrX::~StrX(&local_458);
    errSeen = 1;
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_458,lex_iv_1);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_458.fUnicodeForm,dt_double,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_458);
  if (cVar2 == '\0') {
    if (myStatus != st_FOCA0002) {
      StrX::StrX(&local_458,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
      pcVar1 = local_458.fLocalForm;
      pcVar6 = getStatusString(myStatus);
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x4bb,lex_iv_1,pcVar1,"st_FOCA0002",pcVar6);
      goto LAB_00107ced;
    }
  }
  else {
    StrX::StrX(&local_458,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x4bb,lex_iv_1,local_458.fLocalForm,0);
LAB_00107ced:
    StrX::~StrX(&local_458);
    errSeen = 1;
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_458,lex_iv_2);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_458.fUnicodeForm,dt_double,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_458);
  if (cVar2 == '\0') {
    if (myStatus == st_FOCA0002) goto LAB_00107dca;
    StrX::StrX(&local_458,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
    pcVar1 = local_458.fLocalForm;
    pcVar6 = getStatusString(myStatus);
    printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
           ,0x4bc,lex_iv_2,pcVar1,"st_FOCA0002",pcVar6);
  }
  else {
    StrX::StrX(&local_458,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x4bc,lex_iv_2,local_458.fLocalForm,0);
  }
  StrX::~StrX(&local_458);
  errSeen = 1;
LAB_00107dca:
  iVar11 = 2;
  while (iVar10 = iVar11 + -1, iVar11 != 0) {
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_458,lex_v_ran_v_0);
    pvVar9 = (void *)0x4;
    pXVar4 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_458.fUnicodeForm,dt_double,&myStatus,ver_10,iVar11 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_458);
    if (pXVar4 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_458,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x4da,lex_v_ran_v_0);
      StrX::~StrX(&local_458);
      errSeen = 1;
    }
    else {
      expValue.fValue.f_strVal = (XMLCh *)0x42a67242a2100000;
      expValue._0_8_ = local_120;
      expValue.fValue._8_8_ = local_48;
      expValue.fValue._16_8_ = uStack_40;
      expValue.fValue.f_datetime.f_milisec = (double)local_38;
      bVar3 = compareActualValue(dt_double,*pXVar4,expValue);
      if (!bVar3) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar4);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar4,pvVar9);
    }
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_458,lex_v_ran_v_1);
    pvVar9 = (void *)0x4;
    pXVar4 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_458.fUnicodeForm,dt_double,&myStatus,ver_10,iVar11 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_458);
    if (pXVar4 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_458,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x4db,lex_v_ran_v_1);
      StrX::~StrX(&local_458);
      errSeen = 1;
    }
    else {
      expValue_00.fValue.f_strVal = (XMLCh *)0x7fefffffffffffff;
      expValue_00._0_8_ = local_148;
      expValue_00.fValue._8_8_ = local_60;
      expValue_00.fValue._16_8_ = uStack_58;
      expValue_00.fValue.f_datetime.f_milisec = (double)local_50;
      bVar3 = compareActualValue(dt_double,*pXVar4,expValue_00);
      if (!bVar3) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar4);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar4,pvVar9);
    }
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_458,lex_v_ran_v_2);
    pvVar9 = (void *)0x4;
    pXVar4 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_458.fUnicodeForm,dt_double,&myStatus,ver_10,iVar11 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_458);
    if (pXVar4 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_458,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x4dc,lex_v_ran_v_2);
      StrX::~StrX(&local_458);
      errSeen = 1;
    }
    else {
      expValue_01.fValue.f_long = 0xffefffffffffffff;
      expValue_01._0_8_ = local_170;
      expValue_01.fValue._8_8_ = local_78;
      expValue_01.fValue._16_8_ = uStack_70;
      expValue_01.fValue.f_datetime.f_milisec = (double)local_68;
      bVar3 = compareActualValue(dt_double,*pXVar4,expValue_01);
      if (!bVar3) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar4);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar4,pvVar9);
    }
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_458,lex_v_ran_v_3);
    pvVar9 = (void *)0x4;
    pXVar4 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_458.fUnicodeForm,dt_double,&myStatus,ver_10,iVar11 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_458);
    if (pXVar4 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_458,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x4dd,lex_v_ran_v_3);
      StrX::~StrX(&local_458);
      errSeen = 1;
    }
    else {
      expValue_02.fValue.f_long = 0x10000000000000;
      expValue_02._0_8_ = local_198;
      expValue_02.fValue._8_8_ = local_90;
      expValue_02.fValue._16_8_ = uStack_88;
      expValue_02.fValue.f_datetime.f_milisec = (double)local_80;
      bVar3 = compareActualValue(dt_double,*pXVar4,expValue_02);
      if (!bVar3) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar4);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar4,pvVar9);
    }
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_458,lex_v_ran_v_4);
    pvVar9 = (void *)0x4;
    pXVar4 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_458.fUnicodeForm,dt_double,&myStatus,ver_10,iVar11 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_458);
    if (pXVar4 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_458,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x4de,lex_v_ran_v_4);
      StrX::~StrX(&local_458);
      errSeen = 1;
    }
    else {
      expValue_03.fValue.f_double = -2.2250738585072014e-308;
      expValue_03._0_8_ = local_1c0;
      expValue_03.fValue._8_8_ = local_a8;
      expValue_03.fValue._16_8_ = uStack_a0;
      expValue_03.fValue.f_datetime.f_milisec = (double)local_98;
      bVar3 = compareActualValue(dt_double,*pXVar4,expValue_03);
      if (!bVar3) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar4);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar4,pvVar9);
    }
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_458,lex_v_ran_iv_1);
    pvVar9 = (void *)0x4;
    pXVar4 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_458.fUnicodeForm,dt_double,&myStatus,ver_10,iVar11 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_458);
    if (pXVar4 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_458,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x4e1,lex_v_ran_iv_1);
      StrX::~StrX(&local_458);
      errSeen = 1;
    }
    else {
      uStack_1d4 = (undefined4)local_bc;
      uStack_1d0 = (undefined4)((ulong)local_bc >> 0x20);
      uStack_1cc = (undefined4)uStack_b4;
      uStack_1c8 = (undefined4)((ulong)uStack_b4 >> 0x20);
      expValue_04.fValue._28_4_ = local_ac;
      expValue_04.fValue._24_4_ = uStack_1c8;
      expValue_04.fValue.f_datetime.f_hour = uStack_1d4;
      expValue_04.fValue.f_datetime.f_day = 1;
      expValue_04.fValue.f_datetime.f_second = uStack_1cc;
      expValue_04.fValue.f_datetime.f_min = uStack_1d0;
      expValue_04.fValue.f_long = 0;
      expValue_04._0_8_ = local_1e8;
      bVar3 = compareActualValue(dt_double,*pXVar4,expValue_04);
      if (!bVar3) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar4);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar4,pvVar9);
    }
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_458,lex_v_ran_iv_2);
    pvVar9 = (void *)0x4;
    pXVar4 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_458.fUnicodeForm,dt_double,&myStatus,ver_10,iVar11 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_458);
    if (pXVar4 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_458,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x4e2,lex_v_ran_iv_2);
      StrX::~StrX(&local_458);
      errSeen = 1;
    }
    else {
      uStack_1f8 = (undefined4)((ulong)local_d0 >> 0x20);
      uStack_1f4 = (undefined4)uStack_c8;
      uStack_1f0 = (undefined4)((ulong)uStack_c8 >> 0x20);
      expValue_05.fValue._28_4_ = local_c0;
      expValue_05.fValue._24_4_ = uStack_1f0;
      expValue_05.fValue.f_datetime.f_second = uStack_1f4;
      expValue_05.fValue.f_datetime.f_min = uStack_1f8;
      expValue_05.fValue.f_long = 0;
      expValue_05._0_8_ = local_210;
      expValue_05.fValue._8_8_ = local_d0 << 0x20;
      bVar3 = compareActualValue(dt_double,*pXVar4,expValue_05);
      if (!bVar3) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar4);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar4,pvVar9);
    }
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_458,lex_v_ran_iv_3);
    pvVar9 = (void *)0x4;
    pXVar4 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_458.fUnicodeForm,dt_double,&myStatus,ver_10,iVar11 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_458);
    if (pXVar4 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_458,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x4e3,lex_v_ran_iv_3);
      StrX::~StrX(&local_458);
      errSeen = 1;
    }
    else {
      uStack_224 = (undefined4)local_e4;
      uStack_220 = (undefined4)((ulong)local_e4 >> 0x20);
      uStack_21c = (undefined4)uStack_dc;
      uStack_218 = (undefined4)((ulong)uStack_dc >> 0x20);
      expValue_06.fValue._28_4_ = local_d4;
      expValue_06.fValue._24_4_ = uStack_218;
      expValue_06.fValue.f_datetime.f_hour = uStack_224;
      expValue_06.fValue.f_datetime.f_day = 3;
      expValue_06.fValue.f_datetime.f_second = uStack_21c;
      expValue_06.fValue.f_datetime.f_min = uStack_220;
      expValue_06.fValue.f_long = 0;
      expValue_06._0_8_ = local_238;
      bVar3 = compareActualValue(dt_double,*pXVar4,expValue_06);
      if (!bVar3) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar4);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar4,pvVar9);
    }
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_458,lex_v_ran_iv_4);
    pvVar9 = (void *)0x4;
    pXVar4 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_458.fUnicodeForm,dt_double,&myStatus,ver_10,iVar11 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_458);
    if (pXVar4 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_458,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x4e4,lex_v_ran_iv_4);
      StrX::~StrX(&local_458);
      errSeen = 1;
    }
    else {
      uStack_24c = (undefined4)local_f8;
      uStack_248 = (undefined4)((ulong)local_f8 >> 0x20);
      uStack_244 = (undefined4)uStack_f0;
      uStack_240 = (undefined4)((ulong)uStack_f0 >> 0x20);
      expValue_07.fValue._28_4_ = local_e8;
      expValue_07.fValue._24_4_ = uStack_240;
      expValue_07.fValue.f_datetime.f_hour = uStack_24c;
      expValue_07.fValue.f_datetime.f_day = 3;
      expValue_07.fValue.f_datetime.f_second = uStack_244;
      expValue_07.fValue.f_datetime.f_min = uStack_248;
      expValue_07.fValue.f_long = 0;
      expValue_07._0_8_ = local_260;
      bVar3 = compareActualValue(dt_double,*pXVar4,expValue_07);
      if (!bVar3) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar4);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar4,pvVar9);
    }
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_458,lex_iv_1);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_458.fUnicodeForm,dt_double,&myStatus,ver_10,iVar11 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_458);
    if (pXVar5 == (XSValue *)0x0) {
      if (myStatus != st_FOCA0002) {
        StrX::StrX(&local_458,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
        pcVar1 = local_458.fLocalForm;
        pcVar6 = getStatusString(myStatus);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x4e7,lex_iv_1,pcVar1,"st_FOCA0002",pcVar6);
        StrX::~StrX(&local_458);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_458,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
      pvVar9 = (void *)0x4e7;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x4e7,lex_iv_1);
      StrX::~StrX(&local_458);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar5);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar9);
    }
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_458,lex_iv_2);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_458.fUnicodeForm,dt_double,&myStatus,ver_10,iVar11 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_458);
    iVar11 = iVar10;
    if (pXVar5 == (XSValue *)0x0) {
      if (myStatus != st_FOCA0002) {
        StrX::StrX(&local_458,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
        pcVar1 = local_458.fLocalForm;
        pcVar6 = getStatusString(myStatus);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x4e8,lex_iv_2,pcVar1,"st_FOCA0002",pcVar6);
        StrX::~StrX(&local_458);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_458,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
      pvVar9 = (void *)0x4e8;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x4e8,lex_iv_2);
      StrX::~StrX(&local_458);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar5);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar9);
    }
  }
  iVar11 = 2;
  do {
    if (iVar11 == 0) {
      return;
    }
    myStatus_22 = st_Init;
    StrX::StrX(&local_458,data_rawstr_1);
    pwVar7 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_458.fUnicodeForm,dt_double,&myStatus_22,ver_10,iVar11 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_458);
    if (pwVar7 == (wchar16 *)0x0) {
      StrX::StrX(&local_458,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x508,data_rawstr_1);
      StrX::~StrX(&local_458);
      errSeen = 1;
    }
    else {
      _myStatus = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar3 = xercesc_4_0::XMLString::equals(_myStatus,data_canrep_1);
      if (!bVar3) {
        StrX::StrX(&local_458,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x508,data_rawstr_1,local_458.fLocalForm,_myStatus,data_canrep_1);
        StrX::~StrX(&local_458);
        errSeen = 1;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar7);
      xercesc_4_0::XMLString::release
                ((char **)&myStatus,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    myStatus_22 = st_Init;
    StrX::StrX(&local_458,data_rawstr_2);
    pwVar7 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_458.fUnicodeForm,dt_double,&myStatus_22,ver_10,iVar11 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_458);
    if (pwVar7 == (wchar16 *)0x0) {
      StrX::StrX(&local_458,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x509,data_rawstr_2);
      StrX::~StrX(&local_458);
      errSeen = 1;
    }
    else {
      _myStatus = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar3 = xercesc_4_0::XMLString::equals(_myStatus,data_canrep_2);
      if (!bVar3) {
        StrX::StrX(&local_458,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x509,data_rawstr_2,local_458.fLocalForm,_myStatus,data_canrep_2);
        StrX::~StrX(&local_458);
        errSeen = 1;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar7);
      xercesc_4_0::XMLString::release
                ((char **)&myStatus,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    myStatus_22 = st_Init;
    StrX::StrX(&local_458,data_rawstr_3);
    pwVar7 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_458.fUnicodeForm,dt_double,&myStatus_22,ver_10,iVar11 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_458);
    if (pwVar7 == (wchar16 *)0x0) {
      StrX::StrX(&local_458,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x50a,data_rawstr_3);
      StrX::~StrX(&local_458);
      errSeen = 1;
    }
    else {
      _myStatus = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar3 = xercesc_4_0::XMLString::equals(_myStatus,data_canrep_3);
      if (!bVar3) {
        StrX::StrX(&local_458,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x50a,data_rawstr_3,local_458.fLocalForm,_myStatus,data_canrep_3);
        StrX::~StrX(&local_458);
        errSeen = 1;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar7);
      xercesc_4_0::XMLString::release
                ((char **)&myStatus,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    myStatus_22 = st_Init;
    StrX::StrX(&local_458,data_rawstr_4);
    pwVar7 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_458.fUnicodeForm,dt_double,&myStatus_22,ver_10,iVar11 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_458);
    if (pwVar7 == (wchar16 *)0x0) {
      StrX::StrX(&local_458,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x50b,data_rawstr_4);
      StrX::~StrX(&local_458);
      errSeen = 1;
    }
    else {
      _myStatus = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar3 = xercesc_4_0::XMLString::equals(_myStatus,data_canrep_4);
      if (!bVar3) {
        StrX::StrX(&local_458,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x50b,data_rawstr_4,local_458.fLocalForm,_myStatus,data_canrep_4);
        StrX::~StrX(&local_458);
        errSeen = 1;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar7);
      xercesc_4_0::XMLString::release
                ((char **)&myStatus,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    myStatus_22 = st_Init;
    StrX::StrX(&local_458,data_rawstr_5);
    pwVar7 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_458.fUnicodeForm,dt_double,&myStatus_22,ver_10,iVar11 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_458);
    if (pwVar7 == (wchar16 *)0x0) {
      StrX::StrX(&local_458,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x50c,data_rawstr_5);
      StrX::~StrX(&local_458);
      errSeen = 1;
    }
    else {
      _myStatus = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar3 = xercesc_4_0::XMLString::equals(_myStatus,data_canrep_5);
      if (!bVar3) {
        StrX::StrX(&local_458,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x50c,data_rawstr_5,local_458.fLocalForm,_myStatus,data_canrep_5);
        StrX::~StrX(&local_458);
        errSeen = 1;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar7);
      xercesc_4_0::XMLString::release
                ((char **)&myStatus,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_458,lex_iv_1);
    lVar8 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_458.fUnicodeForm,dt_double,&myStatus,ver_10,iVar11 == 2,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_458);
    if (lVar8 == 0) {
      if (myStatus != st_FOCA0002) {
        StrX::StrX(&local_458,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
        pcVar1 = local_458.fLocalForm;
        pcVar6 = getStatusString(myStatus);
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x50f,lex_iv_1,pcVar1,"st_FOCA0002",pcVar6);
        StrX::~StrX(&local_458);
        goto LAB_001090ed;
      }
    }
    else {
      StrX::StrX(&local_458,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x50f,lex_iv_1);
      StrX::~StrX(&local_458);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar8);
LAB_001090ed:
      errSeen = 1;
    }
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_458,lex_iv_2);
    lVar8 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_458.fUnicodeForm,dt_double,&myStatus,ver_10,iVar11 == 2,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_458);
    if (lVar8 == 0) {
      if (myStatus != st_FOCA0002) {
        StrX::StrX(&local_458,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
        pcVar1 = local_458.fLocalForm;
        pcVar6 = getStatusString(myStatus);
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x510,lex_iv_2,pcVar1,"st_FOCA0002",pcVar6);
        StrX::~StrX(&local_458);
        goto LAB_001091ce;
      }
    }
    else {
      StrX::StrX(&local_458,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x510,lex_iv_2);
      StrX::~StrX(&local_458);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar8);
LAB_001091ce:
      errSeen = 1;
    }
    myStatus_22 = st_Init;
    StrX::StrX(&local_458,lex_v_ran_iv_1);
    pwVar7 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_458.fUnicodeForm,dt_double,&myStatus_22,ver_10,iVar11 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_458);
    if (pwVar7 == (wchar16 *)0x0) {
      StrX::StrX(&local_458,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x513,lex_v_ran_iv_1);
      StrX::~StrX(&local_458);
      errSeen = 1;
    }
    else {
      _myStatus = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar3 = xercesc_4_0::XMLString::equals(_myStatus,lex_v_ran_iv_1_canrep);
      if (!bVar3) {
        StrX::StrX(&local_458,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x513,lex_v_ran_iv_1,local_458.fLocalForm,_myStatus,lex_v_ran_iv_1_canrep);
        StrX::~StrX(&local_458);
        errSeen = 1;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar7);
      xercesc_4_0::XMLString::release
                ((char **)&myStatus,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    myStatus_22 = st_Init;
    StrX::StrX(&local_458,lex_v_ran_iv_2);
    pwVar7 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_458.fUnicodeForm,dt_double,&myStatus_22,ver_10,iVar11 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_458);
    if (pwVar7 == (wchar16 *)0x0) {
      StrX::StrX(&local_458,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x514,lex_v_ran_iv_2);
      StrX::~StrX(&local_458);
      errSeen = 1;
    }
    else {
      _myStatus = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar3 = xercesc_4_0::XMLString::equals(_myStatus,lex_v_ran_iv_2_canrep);
      if (!bVar3) {
        StrX::StrX(&local_458,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x514,lex_v_ran_iv_2,local_458.fLocalForm,_myStatus,lex_v_ran_iv_2_canrep);
        StrX::~StrX(&local_458);
        errSeen = 1;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar7);
      xercesc_4_0::XMLString::release
                ((char **)&myStatus,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    myStatus_22 = st_Init;
    StrX::StrX(&local_458,lex_v_ran_iv_3);
    pwVar7 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_458.fUnicodeForm,dt_double,&myStatus_22,ver_10,iVar11 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_458);
    if (pwVar7 == (wchar16 *)0x0) {
      StrX::StrX(&local_458,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x515,lex_v_ran_iv_3);
      StrX::~StrX(&local_458);
      errSeen = 1;
    }
    else {
      _myStatus = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar3 = xercesc_4_0::XMLString::equals(_myStatus,lex_v_ran_iv_3_canrep);
      if (!bVar3) {
        StrX::StrX(&local_458,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x515,lex_v_ran_iv_3,local_458.fLocalForm,_myStatus,lex_v_ran_iv_3_canrep);
        StrX::~StrX(&local_458);
        errSeen = 1;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar7);
      xercesc_4_0::XMLString::release
                ((char **)&myStatus,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    myStatus_22 = st_Init;
    StrX::StrX(&local_458,lex_v_ran_iv_4);
    pwVar7 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_458.fUnicodeForm,dt_double,&myStatus_22,ver_10,iVar11 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_458);
    if (pwVar7 == (wchar16 *)0x0) {
      StrX::StrX(&local_458,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x516,lex_v_ran_iv_4);
      StrX::~StrX(&local_458);
      errSeen = 1;
      iVar11 = iVar11 + -1;
    }
    else {
      _myStatus = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar3 = xercesc_4_0::XMLString::equals(_myStatus,lex_v_ran_iv_4_canrep);
      if (!bVar3) {
        StrX::StrX(&local_458,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x516,lex_v_ran_iv_4,local_458.fLocalForm,_myStatus,lex_v_ran_iv_4_canrep);
        StrX::~StrX(&local_458);
        errSeen = 1;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar7);
      xercesc_4_0::XMLString::release
                ((char **)&myStatus,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      iVar11 = iVar11 + -1;
    }
  } while( true );
}

Assistant:

void test_dt_double()
{

    const XSValue::DataType dt = XSValue::dt_double;
    bool  toValidate = true;

    const char lex_v_ran_v_0[]="   1234.e+10   \n";
    const char lex_v_ran_v_1[]="+1.7976931348623158e+308";
    const char lex_v_ran_v_2[]="-1.7976931348623158e+308";
    const char lex_v_ran_v_3[]="+2.2250738585072014e-308";
    const char lex_v_ran_v_4[]="-2.2250738585072014e-308";

    XSValue::XSValue_Data act_v_ran_v_0; act_v_ran_v_0.fValue.f_double = (double)1234.e+10;
    XSValue::XSValue_Data act_v_ran_v_1; act_v_ran_v_1.fValue.f_double = (double)+1.7976931348623158e+308;
    XSValue::XSValue_Data act_v_ran_v_2; act_v_ran_v_2.fValue.f_double = (double)-1.7976931348623158e+308;
    XSValue::XSValue_Data act_v_ran_v_3; act_v_ran_v_3.fValue.f_double = (double)+2.2250738585072014e-308;
    XSValue::XSValue_Data act_v_ran_v_4; act_v_ran_v_4.fValue.f_double = (double)-2.2250738585072014e-308;

    const char lex_v_ran_iv_1[]="+1.7976931348623158e+309";
    const char lex_v_ran_iv_2[]="-1.7976931348623158e+309";
    // on linux, hp, aix, the representable range is around e-324
    // or e-325, using e-329 to gain consistent result on all
    // platforms
    const char lex_v_ran_iv_3[]="+2.2250738585072014e-329";
    const char lex_v_ran_iv_4[]="-2.2250738585072014e-329";

    const char lex_v_ran_iv_1_canrep[]="INF";  // " 1.7976931348623158E309";
    const char lex_v_ran_iv_2_canrep[]="-INF"; // "-1.7976931348623158E309";
    const char lex_v_ran_iv_3_canrep[]="0";    // "2.2250738585072014E-329";
    const char lex_v_ran_iv_4_canrep[]="0";    // "-2.2250738585072014E-329";

    XSValue::XSValue_Data lex_iv_ran_v_1; lex_iv_ran_v_1.fValue.f_double = (double)0.0;
    lex_iv_ran_v_1.fValue.f_doubleType.f_doubleEnum = XSValue::DoubleFloatType_PosINF;
    XSValue::XSValue_Data lex_iv_ran_v_2; lex_iv_ran_v_2.fValue.f_double = (double)0.0;
    lex_iv_ran_v_2.fValue.f_doubleType.f_doubleEnum = XSValue::DoubleFloatType_NegINF;
    XSValue::XSValue_Data lex_iv_ran_v_3; lex_iv_ran_v_3.fValue.f_double = (double)0.0;
    lex_iv_ran_v_3.fValue.f_doubleType.f_doubleEnum = XSValue::DoubleFloatType_Zero;
    XSValue::XSValue_Data lex_iv_ran_v_4; lex_iv_ran_v_4.fValue.f_double = (double)0.0;
    lex_iv_ran_v_4.fValue.f_doubleType.f_doubleEnum = XSValue::DoubleFloatType_Zero;

    const char lex_iv_1[]="12x.e+10";
    const char lex_iv_2[]="12.e+1x";

/***
 * 3.2.5.2 Canonical representation
 *
 * The canonical representation for float is defined by prohibiting certain options from the Lexical
 * representation (3.2.5.1).
 * Specifically,
 * 1. the exponent must be indicated by "E".
 * 2. Leading zeroes and the preceding optional "+" sign are prohibited in the exponent.
 * 3. For the mantissa, the preceding optional "+" sign is prohibited and the decimal point is required.
 *    Leading and trailing zeroes are prohibited subject to the following:
 *    number representations must be normalized such that there is a single digit to the left of the decimal point
 *    and at least a single digit to the right of the decimal point.
 *
 ***/

    const char data_rawstr_1[]="    -123.45    \n";
    const char data_canrep_1[]="-1.2345E2";
    const char data_rawstr_2[]="+123.45";
    const char data_canrep_2[]="1.2345E2";
    const char data_rawstr_3[]="+123.45e+0012";
    const char data_canrep_3[]="1.2345E14";
    const char data_rawstr_4[]="+100.000e2";
    const char data_canrep_4[]="1.0E4";
    const char data_rawstr_5[]="00100.23e2";
    const char data_canrep_5[]="1.0023E4";

    /***
     *
     * validate
     * ---------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *    lexical valid
     *            range  valid                           true              n/a
     *            range  invalid                         false           st_FOCA0002
     *    lexical invalid                                false           st_FOCA0002
     *
     ***/

    // lexical valid, range valid
    VALIDATE_TEST(lex_v_ran_v_0 , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran_v_1 , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran_v_2 , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran_v_3 , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran_v_4 , dt, EXP_RET_VALID_TRUE, DONT_CARE);

    // lexical valid, range invalid however XML4C converts to INF / ZERO
    VALIDATE_TEST(lex_v_ran_iv_1 , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran_iv_2 , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran_iv_3 , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran_iv_4 , dt, EXP_RET_VALID_TRUE, DONT_CARE);

    // lexical invalid
    VALIDATE_TEST(lex_iv_1         , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(lex_iv_2         , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);

    /***
     *
     * getActualValue
     * ---------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *  lexical valid
     *          range  valid                              XSValue         n/a
     *          range  invalid                              0            st_Unpresentable
     *  lexical invalid                                     0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *  lexical valid
     *          range  valid                              XSValue         n/a
     *          range  invalid                              0            st_Unpresentable
     *  lexical invalid                                     0            st_FOCA0002
     *
     ***/

    for (int i = 0; i < 2; i++)
    {
        //validation on/off
        toValidate = ( 0 == i) ? true : false;

        // lexical valid, range valid
        ACTVALUE_TEST(lex_v_ran_v_0,  dt, toValidate, EXP_RET_VALUE_TRUE, DONT_CARE, act_v_ran_v_0);
        ACTVALUE_TEST(lex_v_ran_v_1,  dt, toValidate, EXP_RET_VALUE_TRUE, DONT_CARE, act_v_ran_v_1);
        ACTVALUE_TEST(lex_v_ran_v_2,  dt, toValidate, EXP_RET_VALUE_TRUE, DONT_CARE, act_v_ran_v_2);
        ACTVALUE_TEST(lex_v_ran_v_3,  dt, toValidate, EXP_RET_VALUE_TRUE, DONT_CARE, act_v_ran_v_3);
        ACTVALUE_TEST(lex_v_ran_v_4,  dt, toValidate, EXP_RET_VALUE_TRUE, DONT_CARE, act_v_ran_v_4);

        // lexical valid, range invalid
        ACTVALUE_TEST(lex_v_ran_iv_1, dt, toValidate, EXP_RET_VALUE_TRUE, DONT_CARE, lex_iv_ran_v_1);
        ACTVALUE_TEST(lex_v_ran_iv_2, dt, toValidate, EXP_RET_VALUE_TRUE, DONT_CARE, lex_iv_ran_v_2);
        ACTVALUE_TEST(lex_v_ran_iv_3, dt, toValidate, EXP_RET_VALUE_TRUE, DONT_CARE, lex_iv_ran_v_3);
        ACTVALUE_TEST(lex_v_ran_iv_4, dt, toValidate, EXP_RET_VALUE_TRUE, DONT_CARE, lex_iv_ran_v_4);

        // lexical invalid
        ACTVALUE_TEST(lex_iv_1      , dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_0);
        ACTVALUE_TEST(lex_iv_2      , dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_0);

    }

    /***
     *
     * getCanonicalRepresentation
     * ---------------------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *  lexical valid
     *          range  valid                              XMLCh          n/a
     *          range  invalid                              0            st_FOCA0002
     *  lexical invalid                                     0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *  lexical valid
     *          range  valid                              XMLCh          n/a
     *          range  invalid                            XMLCh          n/a
     *  lexical invalid                                     0            st_FOCA0002
     *
     ***/

    for (int j = 0; j < 2; j++)
    {
        //validation on/off
        toValidate = ( 0 == j) ? true : false;

        // lexical valid, range valid
        CANREP_TEST(data_rawstr_1,    dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_1,    DONT_CARE);
        CANREP_TEST(data_rawstr_2,    dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_2,    DONT_CARE);
        CANREP_TEST(data_rawstr_3,    dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_3,    DONT_CARE);
        CANREP_TEST(data_rawstr_4,    dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_4,    DONT_CARE);
        CANREP_TEST(data_rawstr_5,    dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_5,    DONT_CARE);

        // lexical invalid
        CANREP_TEST(lex_iv_1,         dt, toValidate, EXP_RET_CANREP_FALSE,  null_string,     XSValue::st_FOCA0002);
        CANREP_TEST(lex_iv_2,         dt, toValidate, EXP_RET_CANREP_FALSE,  null_string,     XSValue::st_FOCA0002);

        // lexical valid, range invalid (XML4C doesn't treat as invalid)
        CANREP_TEST(lex_v_ran_iv_1,    dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran_iv_1_canrep,    DONT_CARE);
        CANREP_TEST(lex_v_ran_iv_2,    dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran_iv_2_canrep,    DONT_CARE);
        CANREP_TEST(lex_v_ran_iv_3,    dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran_iv_3_canrep,    DONT_CARE);
        CANREP_TEST(lex_v_ran_iv_4,    dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran_iv_4_canrep,    DONT_CARE);
    }
}